

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cc
# Opt level: O3

ArgConvertResult<(absl::lts_20240722::FormatConversionCharSet)262144>
absl::lts_20240722::str_format_internal::FormatConvertImpl
          (wchar_t *v,FormatConversionSpecImpl conv,FormatSinkImpl *sink)

{
  bool bVar1;
  wchar_t *pwVar2;
  FormatSinkImpl *in_R8;
  FormatSinkImpl *in_R9;
  FormatConversionSpecImpl conv_00;
  FormatConversionSpecImpl conv_01;
  
  conv_00._0_4_ = conv.precision_;
  conv_00.precision_ = (int)sink;
  if (conv.conv_ == 0x11) {
    conv_00.width_ = 0;
    FormatConvertImpl((str_format_internal *)v,(VoidPtr)conv._0_8_,conv_00,in_R8);
    bVar1 = true;
  }
  else {
    if (v == (wchar_t *)0x0) {
      pwVar2 = (wchar_t *)0x0;
    }
    else if ((int)conv_00._0_4_ < 0) {
      pwVar2 = (wchar_t *)wcslen(v);
    }
    else {
      pwVar2 = std::__find_if<wchar_t_const*,__gnu_cxx::__ops::_Iter_equals_val<wchar_t_const>>
                         (v,v + conv_00._0_4_);
      pwVar2 = (wchar_t *)((long)pwVar2 - (long)v >> 2);
    }
    conv_01.width_ = 0;
    conv_01.conv_ = (char)conv_00._0_4_;
    conv_01.flags_ = (char)(conv_00._0_4_ >> 8);
    conv_01.length_mod_ = (char)(conv_00._0_4_ >> 0x10);
    conv_01._3_1_ = (char)(conv_00._0_4_ >> 0x18);
    conv_01.precision_ = conv_00.precision_;
    bVar1 = anon_unknown_53::ConvertStringArg((anon_unknown_53 *)v,pwVar2,conv._0_8_,conv_01,in_R9);
  }
  return (ArgConvertResult<(absl::lts_20240722::FormatConversionCharSet)262144>)bVar1;
}

Assistant:

StringPtrConvertResult FormatConvertImpl(const wchar_t* v,
                                         const FormatConversionSpecImpl conv,
                                         FormatSinkImpl* sink) {
  if (conv.conversion_char() == FormatConversionCharInternal::p) {
    return {FormatConvertImpl(VoidPtr(v), conv, sink).value};
  }
  size_t len;
  if (v == nullptr) {
    len = 0;
  } else if (conv.precision() < 0) {
    len = std::wcslen(v);
  } else {
    // If precision is set, we look for the NUL-terminator on the valid range.
    len = static_cast<size_t>(std::find(v, v + conv.precision(), L'\0') - v);
  }
  return {ConvertStringArg(v, len, conv, sink)};
}